

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol.h
# Opt level: O2

void mp::WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>
               (CStringRef filename,SolutionAdapter<StrictMockProblemBuilder> *sol)

{
  SuffixSet *suffixes;
  ulong uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  int num_values;
  BufferedFile file;
  int num_dual_values;
  int num_vars;
  int num_constraints;
  int local_54;
  BufferedFile local_50;
  double local_48;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  fmt::BufferedFile::BufferedFile(&local_50,filename,(CStringRef)0x1df5e1);
  internal::WriteMessage(&local_50,sol->message_);
  fmt::BufferedFile::print<>(&local_50,(CStringRef)0x1df5e4);
  local_54 = (int)(sol->options_).size_;
  if (local_54 != 0) {
    fmt::BufferedFile::print<int>(&local_50,(CStringRef)0x1eebdd,&local_54);
    for (lVar2 = 0; lVar2 < local_54; lVar2 = lVar2 + 1) {
      local_48 = (double)(sol->options_).data_[lVar2];
      fmt::BufferedFile::print<long>(&local_50,(CStringRef)0x1eebdd,(long *)&local_48);
    }
  }
  local_54 = (int)(sol->values_).size_;
  local_40 = (uint)(sol->dual_values_).size_;
  local_3c = SolutionAdapter<StrictMockProblemBuilder>::num_vars(sol);
  local_34 = SolutionAdapter<StrictMockProblemBuilder>::num_algebraic_cons(sol);
  fmt::BufferedFile::print<int,int,int,int>
            (&local_50,(CStringRef)0x1df5ed,&local_34,(int *)&local_40,&local_3c,&local_54);
  uVar1 = 0;
  uVar3 = (ulong)local_40;
  if ((int)local_40 < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    local_48 = (sol->dual_values_).data_[uVar1];
    fmt::BufferedFile::print<double>(&local_50,(CStringRef)0x1df628,&local_48);
  }
  for (lVar2 = 0; lVar2 < local_54; lVar2 = lVar2 + 1) {
    local_48 = (sol->values_).data_[lVar2];
    fmt::BufferedFile::print<double>(&local_50,(CStringRef)0x1df628,&local_48);
  }
  local_48 = (double)CONCAT44(local_48._4_4_,sol->objno_ + -1);
  local_38 = sol->status_;
  fmt::BufferedFile::print<int,int>(&local_50,(CStringRef)0x1df5fe,(int *)&local_48,&local_38);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    suffixes = SolutionAdapter<StrictMockProblemBuilder>::suffixes
                         (sol,*(Kind *)((long)&DAT_001da080 + lVar2));
    internal::WriteSuffixes<mp::BasicSuffixSet<std::allocator<char>>>(&local_50,suffixes);
  }
  fmt::BufferedFile::~BufferedFile(&local_50);
  return;
}

Assistant:

void WriteSolFile(fmt::CStringRef filename, const Solution &sol) {
  fmt::BufferedFile file(filename, "wb");
  internal::WriteMessage(file, sol.message());
  // Write options.
  file.print("Options\n");
  if (int num_options = sol.num_options()) {
    file.print("{}\n", num_options);
    for (int i = 0; i < num_options; ++i)
      file.print("{}\n", sol.option(i));
  }
  int num_values = sol.num_values(), num_dual_values = sol.num_dual_values(),
    num_vars = sol.num_vars(), num_constraints = sol.num_algebraic_cons();
  file.print("{0}\n{1}\n{2}\n{3}\n",
    num_constraints, num_dual_values, num_vars, num_values);
  for (int i = 0, n = num_dual_values; i < n; ++i)
    file.print("{:.16}\n", sol.dual_value(i));
  for (int i = 0; i < num_values; ++i)
    file.print("{:.16}\n", sol.value(i));
  file.print("objno {} {}\n", sol.objno()-1, sol.status());
  suf::Kind kinds[] = {suf::VAR, suf::CON, suf::OBJ, suf::PROBLEM};
  for (std::size_t i = 0, n = sizeof(kinds) / sizeof(*kinds); i < n; ++i)
    internal::WriteSuffixes(file, sol.suffixes(kinds[i]));
}